

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall
cmCursesLongMessageForm::UpdateContent(cmCursesLongMessageForm *this,string *output,string *title)

{
  ulong uVar1;
  char *msg;
  int local_34;
  string *title_local;
  string *output_local;
  cmCursesLongMessageForm *this_local;
  
  std::__cxx11::string::operator=((string *)&this->Title,(string *)title);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 < 60000) {
      std::__cxx11::string::push_back((char)this + '\x10');
      std::__cxx11::string::append((string *)&this->Messages);
      form_driver((this->super_cmCursesForm).Form,0x212);
      form_driver((this->super_cmCursesForm).Form,0x218);
      msg = (char *)std::__cxx11::string::c_str();
      DrawMessage(this,msg);
    }
  }
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
  if (_stdscr == 0) {
    local_34 = -1;
  }
  else {
    local_34 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_34,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateContent(std::string const& output,
                                            std::string const& title)
{
  this->Title = title;

  if (!output.empty() && this->Messages.size() < MAX_CONTENT_SIZE) {
    this->Messages.push_back('\n');
    this->Messages.append(output);
    form_driver(this->Form, REQ_NEXT_LINE);
    form_driver(this->Form, REQ_BEG_LINE);
    this->DrawMessage(output.c_str());
  }

  this->UpdateStatusBar();
  touchwin(stdscr);
  refresh();
}